

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialog::setTextValue(QInputDialog *this,QString *text)

{
  QInputDialogPrivate *pQVar1;
  QInputDialog *in_RSI;
  QPlainTextEdit *in_RDI;
  QInputDialogPrivate *unaff_retaddr;
  QInputDialogPrivate *d;
  QString *in_stack_ffffffffffffffd8;
  QPlainTextEdit *text_00;
  
  text_00 = in_RDI;
  pQVar1 = d_func((QInputDialog *)0x79c5a1);
  setInputMode(in_RSI,(InputMode)((ulong)pQVar1 >> 0x20));
  if (pQVar1->inputWidget == &pQVar1->lineEdit->super_QWidget) {
    QLineEdit::setText((QLineEdit *)in_RDI,in_stack_ffffffffffffffd8);
  }
  else if (pQVar1->inputWidget == (QWidget *)pQVar1->plainTextEdit) {
    QPlainTextEdit::setPlainText(in_RDI,in_stack_ffffffffffffffd8);
  }
  else if (pQVar1->inputWidget == &pQVar1->comboBox->super_QWidget) {
    QInputDialogPrivate::setComboBoxText(unaff_retaddr,(QString *)text_00);
  }
  else {
    QInputDialogPrivate::setListViewText((QInputDialogPrivate *)text,(QString *)d);
  }
  return;
}

Assistant:

void QInputDialog::setTextValue(const QString &text)
{
    Q_D(QInputDialog);

    setInputMode(TextInput);
    if (d->inputWidget == d->lineEdit) {
        d->lineEdit->setText(text);
    } else if (d->inputWidget == d->plainTextEdit) {
        d->plainTextEdit->setPlainText(text);
    } else if (d->inputWidget == d->comboBox) {
        d->setComboBoxText(text);
    } else {
        d->setListViewText(text);
    }
}